

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ManSetFlowRefs(Gia_Man_t *p,Vec_Int_t *vRefs)

{
  uint uVar1;
  uint *puVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  uVar8 = p->nObjs;
  if (vRefs->nCap < (int)uVar8) {
    if (vRefs->pArray == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar6 = (int *)realloc(vRefs->pArray,(long)(int)uVar8 << 2);
    }
    vRefs->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vRefs->nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset(vRefs->pArray,0,(ulong)uVar8 * 4);
  }
  vRefs->nSize = uVar8;
  if (0 < p->nObjs) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pGVar7 = p->pObjs;
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      pGVar3 = (Gia_Obj_t *)(&pGVar7->field_0x0 + lVar10);
      uVar8 = (uint)*(ulong *)pGVar3;
      uVar9 = *(ulong *)pGVar3 & 0x1fffffff;
      if (uVar9 != 0x1fffffff && -1 < (int)uVar8) {
        uVar1 = *(uint *)((long)pGVar7 + lVar10 + (ulong)(uint)((int)uVar9 << 2) * -3);
        if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
          uVar9 = (ulong)-(uVar8 & 0x1fffffff) + lVar11;
          iVar5 = (int)uVar9;
          if ((iVar5 < 0) || (vRefs->nSize <= iVar5)) goto LAB_007746c5;
          vRefs->pArray[uVar9 & 0xffffffff] = vRefs->pArray[uVar9 & 0xffffffff] + 1;
        }
        uVar8 = *(uint *)((long)pGVar3 +
                         (ulong)((uint)(*(ulong *)(&pGVar7->field_0x0 + lVar10) >> 0x1e) &
                                0x7ffffffc) * -3);
        if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
          uVar9 = (ulong)-((uint)(*(ulong *)(&pGVar7->field_0x0 + lVar10) >> 0x20) & 0x1fffffff) +
                  lVar11;
          iVar5 = (int)uVar9;
          if ((iVar5 < 0) || (vRefs->nSize <= iVar5)) goto LAB_007746c5;
          vRefs->pArray[uVar9 & 0xffffffff] = vRefs->pArray[uVar9 & 0xffffffff] + 1;
        }
        puVar2 = p->pMuxes;
        if (puVar2 == (uint *)0x0) {
          iVar5 = Gia_ObjIsMuxType(pGVar3);
          if (iVar5 != 0) {
            pGVar7 = Gia_ObjRecognizeMux(pGVar3,&local_40,&local_38);
            pGVar7 = (Gia_Obj_t *)((ulong)pGVar7 & 0xfffffffffffffffe);
            local_38 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
            local_40 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
            if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
              pGVar3 = p->pObjs;
              if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) goto LAB_007746e4;
              uVar8 = (int)((long)pGVar7 - (long)pGVar3 >> 2) * -0x55555555;
              if (((int)uVar8 < 0) || (vRefs->nSize <= (int)uVar8)) goto LAB_007746c5;
              vRefs->pArray[uVar8 & 0x7fffffff] = vRefs->pArray[uVar8 & 0x7fffffff] + -1;
            }
            if ((local_38 == local_40) &&
               ((~*(uint *)local_38 & 0x1fffffff) != 0 && -1 < (int)*(uint *)local_38)) {
              pGVar7 = p->pObjs;
              if ((local_38 < pGVar7) || (pGVar7 + p->nObjs <= local_38)) goto LAB_007746e4;
              uVar8 = (int)((long)local_38 - (long)pGVar7 >> 2) * -0x55555555;
              if (((int)uVar8 < 0) || (vRefs->nSize <= (int)uVar8)) goto LAB_007746c5;
              piVar6 = vRefs->pArray + (uVar8 & 0x7fffffff);
              iVar5 = -1;
LAB_007745d6:
              *piVar6 = *piVar6 + iVar5;
            }
          }
        }
        else if (puVar2[lVar11] != 0) {
          if (p->nObjs <= lVar11) {
LAB_007746e4:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if ((int)puVar2[lVar11] < 0) {
LAB_00774703:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar8 = puVar2[lVar11] >> 1;
          if (p->nObjs <= (int)uVar8) goto LAB_007746a6;
          if ((~*(uint *)(pGVar7 + uVar8) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar7 + uVar8))
          {
            uVar8 = puVar2[lVar11];
            if (uVar8 == 0) {
              uVar8 = 0xffffffff;
            }
            else {
              if ((int)uVar8 < 0) goto LAB_00774703;
              uVar8 = uVar8 >> 1;
            }
            if ((-1 < (int)uVar8) && ((int)uVar8 < vRefs->nSize)) {
              piVar6 = vRefs->pArray + uVar8;
              iVar5 = 1;
              goto LAB_007745d6;
            }
            goto LAB_007746c5;
          }
        }
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < p->nObjs);
  }
  pVVar4 = p->vCos;
  if (0 < pVVar4->nSize) {
    piVar6 = pVVar4->pArray;
    lVar10 = 0;
    do {
      iVar5 = piVar6[lVar10];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_007746a6:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar8 = iVar5 - (*(uint *)(p->pObjs + iVar5) & 0x1fffffff);
      if (((int)uVar8 < 0) || (p->nObjs <= (int)uVar8)) goto LAB_007746a6;
      uVar1 = *(uint *)(p->pObjs + uVar8);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        if (vRefs->nSize <= (int)uVar8) {
LAB_007746c5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        vRefs->pArray[uVar8] = vRefs->pArray[uVar8] + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar4->nSize);
  }
  if (0 < vRefs->nSize) {
    piVar6 = vRefs->pArray;
    lVar10 = 0;
    do {
      if (piVar6[lVar10] < 1) {
        piVar6[lVar10] = 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vRefs->nSize);
  }
  return;
}

Assistant:

void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs )
{
    int fDiscount = 1;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, Id;
    Vec_IntFill( vRefs, Gia_ManObjNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
            Vec_IntAddToEntry( vRefs, Gia_ObjFaninId0(pObj, i), 1 );
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
            Vec_IntAddToEntry( vRefs, Gia_ObjFaninId1(pObj, i), 1 );
        if ( p->pMuxes )
        {
            if ( Gia_ObjIsMuxId(p, i) && Gia_ObjIsAnd(Gia_ObjFanin2(p, pObj)) )
                Vec_IntAddToEntry( vRefs, Gia_ObjFaninId2(p, i), 1 );
        }
        else if ( fDiscount && Gia_ObjIsMuxType(pObj) ) // discount XOR/MUX
        {
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            if ( Gia_ObjIsAnd(pCtrl) )
                Vec_IntAddToEntry( vRefs, Gia_ObjId(p, pCtrl), -1 );
            if ( pData0 == pData1 && Gia_ObjIsAnd(pData0) )
                Vec_IntAddToEntry( vRefs, Gia_ObjId(p, pData0), -1 );
        }
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        if ( Gia_ObjIsAnd(Gia_ManObj(p, Id)) )
            Vec_IntAddToEntry( vRefs, Id, 1 );
    for ( i = 0; i < Vec_IntSize(vRefs); i++ )
        Vec_IntUpdateEntry( vRefs, i, 1 );
}